

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.h
# Opt level: O0

void __thiscall soplex::SPxWeightST<double>::SPxWeightST(SPxWeightST<double> *this)

{
  undefined8 *in_RDI;
  char *in_stack_ffffffffffffffb8;
  SPxStarter<double> *in_stack_ffffffffffffffc0;
  undefined8 *p_fac;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 *puVar1;
  DataArray<int> *in_stack_ffffffffffffffd0;
  DataArray<bool> *this_00;
  
  SPxStarter<double>::SPxStarter(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__SPxWeightST_004eddc8;
  DataArray<int>::DataArray
            (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             (int)in_stack_ffffffffffffffc8,(Real)in_stack_ffffffffffffffc0);
  this_00 = (DataArray<bool> *)(in_RDI + 9);
  Array<double>::Array((Array<double> *)this_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  puVar1 = in_RDI + 0xc;
  Array<double>::Array((Array<double> *)this_00,(int)((ulong)puVar1 >> 0x20));
  p_fac = in_RDI + 0xf;
  DataArray<bool>::DataArray(this_00,(int)((ulong)puVar1 >> 0x20),(int)puVar1,(Real)p_fac);
  DataArray<bool>::DataArray(this_00,(int)((ulong)puVar1 >> 0x20),(int)puVar1,(Real)p_fac);
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  return;
}

Assistant:

SPxWeightST()
      : SPxStarter<R>("Weight")
   {
      weight = nullptr;
      coWeight = nullptr;
      assert(isConsistent());
   }